

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O0

int X509_check_trust(X509 *x,int id,int flags)

{
  X509_TRUST *pXVar1;
  int extraout_EDX;
  X509_TRUST *pt;
  int rv;
  int flags_local;
  int id_local;
  X509 *x_local;
  
  if (id == -1) {
    x_local._4_4_ = 1;
  }
  else if (id == 0) {
    x_local._4_4_ = obj_trust(0x38e,(X509 *)x);
    if (x_local._4_4_ == 3) {
      x_local._4_4_ = trust_compat((X509_TRUST *)0x0,(X509 *)x);
    }
  }
  else {
    pXVar1 = X509_TRUST_get0(id);
    if (pXVar1 == (X509_TRUST *)0x0) {
      x_local._4_4_ = obj_trust(id,(X509 *)x);
    }
    else {
      x_local._4_4_ = (*pXVar1->check_trust)(pXVar1,x,extraout_EDX);
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_check_trust(X509 *x, int id, int flags) {
  if (id == -1) {
    return X509_TRUST_TRUSTED;
  }
  // We get this as a default value
  if (id == 0) {
    int rv = obj_trust(NID_anyExtendedKeyUsage, x);
    if (rv != X509_TRUST_UNTRUSTED) {
      return rv;
    }
    return trust_compat(NULL, x);
  }
  const X509_TRUST *pt = X509_TRUST_get0(id);
  if (pt == NULL) {
    // Unknown trust IDs are silently reintrepreted as NIDs. This is unreachable
    // from the certificate verifier itself, but wpa_supplicant relies on it.
    // Note this relies on commonly-used NIDs and trust IDs not colliding.
    return obj_trust(id, x);
  }
  return pt->check_trust(pt, x);
}